

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

MutableCodePointTrie *
icu_63::anon_unknown_0::MutableCodePointTrie::fromUCPMap(UCPMap *map,UErrorCode *errorCode)

{
  UBool UVar1;
  MutableCodePointTrie *pMVar2;
  size_t size;
  MutableCodePointTrie *local_60;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t value;
  UChar32 end;
  UChar32 start;
  undefined1 local_31;
  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie> local_30;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> mutableTrie;
  uint32_t initialValue;
  uint32_t errorValue;
  UErrorCode *errorCode_local;
  UCPMap *map_local;
  
  mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr._4_4_
       = ucpmap_get_63(map,-1);
  size = 0x10ffff;
  mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr._0_4_
       = ucpmap_get_63(map,0x10ffff);
  pMVar2 = (MutableCodePointTrie *)UMemory::operator_new((UMemory *)0x11040,size);
  local_31 = 0;
  local_60 = (MutableCodePointTrie *)0x0;
  if (pMVar2 != (MutableCodePointTrie *)0x0) {
    local_31 = 1;
    MutableCodePointTrie
              (pMVar2,(uint32_t)
                      mutableTrie.
                      super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.
                      ptr,
               mutableTrie.
               super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr._4_4_
               ,errorCode);
    local_60 = pMVar2;
  }
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::LocalPointer
            ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_30,local_60
             ,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    value = 0;
    while (local_50 = ucpmap_getRange_63(map,value,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                         (void *)0x0,&local_54), -1 < (int)local_50) {
      if (local_54 !=
          (uint32_t)
          mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.
          ptr) {
        if (value == local_50) {
          pMVar2 = LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>::operator->
                             (&local_30);
          set(pMVar2,value,local_54,errorCode);
        }
        else {
          pMVar2 = LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>::operator->
                             (&local_30);
          setRange(pMVar2,value,local_50,local_54,errorCode);
        }
      }
      value = local_50 + 1;
    }
    UVar1 = ::U_SUCCESS(*errorCode);
    if (UVar1 == '\0') {
      map_local = (UCPMap *)0x0;
    }
    else {
      map_local = (UCPMap *)
                  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>::orphan
                            (&local_30);
    }
  }
  else {
    map_local = (UCPMap *)0x0;
  }
  end = 1;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::~LocalPointer
            ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_30);
  return (MutableCodePointTrie *)map_local;
}

Assistant:

MutableCodePointTrie *MutableCodePointTrie::fromUCPMap(const UCPMap *map, UErrorCode &errorCode) {
    // Use the highValue as the initialValue to reduce the highStart.
    uint32_t errorValue = ucpmap_get(map, -1);
    uint32_t initialValue = ucpmap_get(map, 0x10ffff);
    LocalPointer<MutableCodePointTrie> mutableTrie(
        new MutableCodePointTrie(initialValue, errorValue, errorCode),
        errorCode);
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucpmap_getRange(map, start, UCPMAP_RANGE_NORMAL, 0,
                                  nullptr, nullptr, &value)) >= 0) {
        if (value != initialValue) {
            if (start == end) {
                mutableTrie->set(start, value, errorCode);
            } else {
                mutableTrie->setRange(start, end, value, errorCode);
            }
        }
        start = end + 1;
    }
    if (U_SUCCESS(errorCode)) {
        return mutableTrie.orphan();
    } else {
        return nullptr;
    }
}